

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O0

void __thiscall DirectionCone_VectorInCone_Test::TestBody(DirectionCone_VectorInCone_Test *this)

{
  bool bVar1;
  float fVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  Vector3f VVar8;
  AssertionResult gtest_ar_1;
  Vector3f w;
  Float phi;
  int k;
  int nk;
  Float bestDot;
  Vector3f wBest;
  Frame f;
  Float sinTheta;
  AssertionResult gtest_ar;
  Vector3f wClosest;
  Vector3f wRandom;
  int j;
  DirectionCone dc;
  int i;
  RNG rng;
  float in_stack_fffffffffffffdf8;
  float in_stack_fffffffffffffdfc;
  RNG *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe10;
  float in_stack_fffffffffffffe14;
  Message *in_stack_fffffffffffffe18;
  Vector3f *in_stack_fffffffffffffe20;
  Vector3f *in_stack_fffffffffffffe28;
  DirectionCone *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  Message *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffe9c;
  Frame *in_stack_fffffffffffffea0;
  double *in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  double *local_120;
  float local_118;
  float local_114;
  int local_110;
  undefined4 local_10c;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  Tuple3<pbrt::Vector3,_float> in_stack_ffffffffffffff10;
  AssertionResult local_a0;
  Tuple3<pbrt::Vector3,_float> local_90;
  Tuple3<pbrt::Vector3,_float> local_80;
  Tuple3<pbrt::Vector3,_float> local_70;
  Tuple3<pbrt::Vector3,_float> local_64;
  Tuple3<pbrt::Vector3,_float> local_58 [2];
  Tuple3<pbrt::Vector3,_float> local_40;
  int local_34;
  uint local_24;
  int local_1c;
  RNG local_18;
  undefined1 auVar7 [56];
  
  pbrt::RNG::RNG(&local_18);
  for (local_1c = 0; local_1c < 100; local_1c = local_1c + 1) {
    RandomCone((RNG *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    for (local_34 = 0; local_34 < 100; local_34 = local_34 + 1) {
      pbrt::RNG::Uniform<float>(in_stack_fffffffffffffe00);
      pbrt::RNG::Uniform<float>(in_stack_fffffffffffffe00);
      auVar7 = (undefined1  [56])0x0;
      pbrt::Point2<float>::Point2
                ((Point2<float> *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                 in_stack_fffffffffffffdf8);
      VVar8 = pbrt::SampleUniformSphere((Point2f *)in_stack_fffffffffffffe20);
      local_80.z = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar3._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar3._8_56_ = auVar7;
      local_80._0_8_ = vmovlpd_avx(auVar3._0_16_);
      auVar7 = ZEXT856(0);
      local_70._0_8_ = local_80._0_8_;
      local_70.z = local_80.z;
      local_58[0]._0_8_ = local_80._0_8_;
      local_58[0].z = local_80.z;
      local_40._0_8_ = local_80._0_8_;
      local_40.z = local_80.z;
      VVar8 = pbrt::DirectionCone::ClosestVectorInCone
                        ((DirectionCone *)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         in_stack_ffffffffffffff10);
      local_90.z = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar4._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar4._8_56_ = auVar7;
      local_90._0_8_ = vmovlpd_avx(auVar4._0_16_);
      local_64._0_8_ = local_90._0_8_;
      local_64.z = local_90.z;
      bVar1 = pbrt::Inside(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      if (bVar1) {
        pbrt::Dot<float>((Vector3<float> *)&local_64,(Vector3<float> *)&local_40);
        testing::internal::CmpHelperGT<float,double>
                  ((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (float *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   in_stack_fffffffffffffeb0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe30);
          testing::AssertionResult::failure_message((AssertionResult *)0x6820f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe30,
                     (Type)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                     (char *)in_stack_fffffffffffffe20,
                     (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     in_stack_fffffffffffffe78);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe00);
          testing::Message::~Message((Message *)0x682155);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x6821aa);
      }
      else {
        vfmadd213ss_fma(ZEXT416(local_24),ZEXT416(local_24 ^ 0x80000000),
                        SUB6416(ZEXT464(0x3f800000),0));
        pbrt::SafeSqrt(0.0);
        pbrt::Frame::FromZ(in_stack_fffffffffffffe20);
        pbrt::Vector3<float>::Vector3((Vector3<float> *)0x68221d);
        in_stack_fffffffffffffef8 = -1.0;
        local_10c = 1000;
        for (local_110 = 0; local_110 < 1000; local_110 = local_110 + 1) {
          fVar2 = ((float)local_110 + 0.5) / 1000.0;
          local_114 = (fVar2 + fVar2) * 3.1415927;
          auVar7 = (undefined1  [56])0x0;
          VVar8 = pbrt::SphericalDirection
                            (SUB84(in_stack_fffffffffffffe28,0),
                             (Float)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                             SUB84(in_stack_fffffffffffffe20,0));
          local_118 = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar5._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar5._8_56_ = auVar7;
          local_120 = (double *)vmovlpd_avx(auVar5._0_16_);
          VVar8 = pbrt::Frame::FromLocal
                            (in_stack_fffffffffffffea0,
                             (Vector3f *)
                             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          in_stack_fffffffffffffeb8 = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar6._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar6._8_56_ = auVar7;
          in_stack_fffffffffffffeb0 = (double *)vmovlpd_avx(auVar6._0_16_);
          in_stack_fffffffffffffec4 = SUB84(in_stack_fffffffffffffeb0,0);
          in_stack_fffffffffffffec8 = (undefined4)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
          in_stack_fffffffffffffecc = in_stack_fffffffffffffeb8;
          local_120 = in_stack_fffffffffffffeb0;
          local_118 = in_stack_fffffffffffffeb8;
          fVar2 = pbrt::Dot<float>((Vector3<float> *)&local_120,(Vector3<float> *)&local_40);
          if (in_stack_fffffffffffffef8 < fVar2) {
            in_stack_fffffffffffffefc = SUB84(local_120,0);
            in_stack_fffffffffffffef8 =
                 pbrt::Dot<float>((Vector3<float> *)&local_120,(Vector3<float> *)&local_40);
          }
        }
        in_stack_fffffffffffffe9c =
             pbrt::Dot<float>((Vector3<float> *)&stack0xfffffffffffffefc,(Vector3<float> *)&local_64
                             );
        testing::internal::CmpHelperGT<float,double>
                  ((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (float *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   in_stack_fffffffffffffeb0);
        in_stack_fffffffffffffe47 =
             testing::AssertionResult::operator_cast_to_bool
                       ((AssertionResult *)&stack0xfffffffffffffea0);
        if (!(bool)in_stack_fffffffffffffe47) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe30);
          in_stack_fffffffffffffe30 =
               (DirectionCone *)
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffe00,
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          in_stack_fffffffffffffe28 =
               (Vector3f *)
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffe00,
                          (char (*) [5])
                          CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          in_stack_fffffffffffffe20 =
               (Vector3f *)
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffe00,
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          in_stack_fffffffffffffe18 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffe00,
                          (char (*) [7])
                          CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          in_stack_fffffffffffffe14 =
               pbrt::Dot<float>((Vector3<float> *)&stack0xfffffffffffffefc,
                                (Vector3<float> *)&local_64);
          in_stack_fffffffffffffe84 = in_stack_fffffffffffffe14;
          testing::Message::operator<<
                    ((Message *)in_stack_fffffffffffffe00,
                     (float *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          in_stack_fffffffffffffe00 =
               (RNG *)testing::AssertionResult::failure_message((AssertionResult *)0x682518);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe30,
                     (Type)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                     (char *)in_stack_fffffffffffffe20,
                     (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     in_stack_fffffffffffffe78);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe00);
          testing::Message::~Message((Message *)0x682572);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x6825c7);
      }
    }
  }
  return;
}

Assistant:

TEST(DirectionCone, VectorInCone) {
    RNG rng;
    for (int i = 0; i < 100; ++i) {
        DirectionCone dc = RandomCone(rng);

        for (int j = 0; j < 100; ++j) {
            Vector3f wRandom =
                SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
            Vector3f wClosest = dc.ClosestVectorInCone(wRandom);

            if (Inside(dc, wRandom))
                EXPECT_GT(Dot(wClosest, wRandom), .999);
            else {
                // Uniformly sample the circle at the cone's boundary and
                // keep the vector that's closest to wRandom.
                Float sinTheta = SafeSqrt(1 - dc.cosTheta * dc.cosTheta);
                Frame f = Frame::FromZ(dc.w);

                Vector3f wBest;
                Float bestDot = -1;
                const int nk = 1000;
                for (int k = 0; k < nk; ++k) {
                    Float phi = (k + .5) / nk * 2 * Pi;
                    Vector3f w = SphericalDirection(sinTheta, dc.cosTheta, phi);
                    w = f.FromLocal(w);
                    if (Dot(w, wRandom) > bestDot) {
                        wBest = w;
                        bestDot = Dot(w, wRandom);
                    }
                }
                EXPECT_GT(Dot(wBest, wClosest), .999)
                    << wBest << " vs " << wClosest << ", dot " << Dot(wBest, wClosest);
            }
        }
    }
}